

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerApp.cpp
# Opt level: O1

unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> __thiscall
helics::BrokerApp::generateParser(BrokerApp *this,bool noTypeOption)

{
  App *this_00;
  int in_EDX;
  pointer *__ptr;
  undefined7 in_register_00000031;
  string local_98;
  string local_78;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  std::make_unique<helics::helicsCLI11App,char_const(&)[19]>((char (*) [19])this);
  if (in_EDX == 0) {
    helicsCLI11App::addTypeOption
              ((helicsCLI11App *)
               (this->broker).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               true);
  }
  if (*(long *)(CONCAT71(in_register_00000031,noTypeOption) + 0x18) == 0) {
    this_00 = (App *)(this->broker).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"--name,-n","");
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"name of the broker","");
    CLI::App::
    add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
              (this_00,&local_78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (CONCAT71(in_register_00000031,noTypeOption) + 0x10),&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  local_58._M_unused._M_object =
       (this->broker).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *(undefined1 *)&((element_type *)((long)local_58._M_unused._0_8_ + 0x48))->_vptr_Broker = 1;
  local_58._8_8_ = 0;
  pcStack_40 = CLI::std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/BrokerApp.cpp:147:17)>
               ::_M_invoke;
  local_48 = CLI::std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/BrokerApp.cpp:147:17)>
             ::_M_manager;
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
  operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
             *)((long)local_58._M_unused._0_8_ + 0x150),
            (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
             *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  return (__uniq_ptr_data<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>,_true,_true>
          )(__uniq_ptr_data<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<helicsCLI11App> BrokerApp::generateParser(bool noTypeOption)
{
    auto app = std::make_unique<helicsCLI11App>("Broker application");
    if (!noTypeOption) {
        app->addTypeOption();
    }

    if (name.empty()) {
        app->add_option("--name,-n", name, "name of the broker");
    }
    app->allow_extras();
    auto* app_p = app.get();
    app->footer([app_p]() {
        auto coreType = coreTypeFromString((*app_p)["--coretype"]->as<std::string>());
        BrokerFactory::displayHelp(coreType);
        return std::string();
    });
    return app;
}